

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msg32,
              secp256k1_pubkey *pubkey)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  secp256k1_scalar m;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej pubkeyj;
  secp256k1_strauss_point_state ps [1];
  secp256k1_fe zr [8];
  uchar c [32];
  secp256k1_ge pre_a [8];
  secp256k1_scalar local_e88;
  secp256k1_scalar local_e68;
  secp256k1_ge local_e40;
  secp256k1_scalar local_de8;
  secp256k1_scalar local_dc8;
  secp256k1_scalar local_da8;
  secp256k1_scalar local_d88;
  secp256k1_strauss_state local_d68;
  secp256k1_gej local_d48;
  undefined1 local_cc8 [104];
  undefined1 local_c60 [16];
  int local_c50;
  secp256k1_strauss_point_state local_c48;
  secp256k1_fe local_838 [8];
  secp256k1_gej local_6f8 [8];
  secp256k1_ge local_2f8 [8];
  
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_ecdsa_verify_cold_1();
  }
  else {
    secp256k1_scalar_set_b32(&local_de8,msg32,(int *)0x0);
    local_e68.d[0] = *(uint64_t *)sig->data;
    local_e68.d[1] = *(uint64_t *)(sig->data + 8);
    local_e68.d[2] = *(uint64_t *)(sig->data + 0x10);
    local_e68.d[3] = *(uint64_t *)(sig->data + 0x18);
    uVar1 = *(ulong *)(sig->data + 0x20);
    uVar2 = *(ulong *)(sig->data + 0x28);
    uVar3 = *(uint64_t *)(sig->data + 0x30);
    uVar4 = *(ulong *)(sig->data + 0x38);
    uVar5 = -(int)((long)uVar4 >> 0x3f);
    uVar8 = uVar5 ^ 1;
    uVar7 = uVar8;
    if (uVar3 == 0xffffffffffffffff) {
      uVar7 = 0;
    }
    if (0x5d576e7357a4501c < uVar2) {
      uVar8 = 0;
    }
    uVar8 = (uVar8 | uVar7 | uVar4 < 0x7fffffffffffffff) ^ 1;
    uVar7 = 0;
    if (0xdfe92f46681b20a0 < uVar1) {
      uVar7 = uVar8;
    }
    if (0x5d576e7357a4501d < uVar2) {
      uVar7 = uVar8;
    }
    if (uVar7 != 0 || uVar5 != 0) {
      return 0;
    }
    local_e88.d[0] = uVar1;
    local_e88.d[1] = uVar2;
    local_e88.d[2] = uVar3;
    local_e88.d[3] = uVar4;
    iVar6 = secp256k1_pubkey_load(ctx,&local_e40,pubkey);
    if (iVar6 == 0) {
      return 0;
    }
    auVar10._0_4_ = -(uint)((int)local_e68.d[0] == 0 && (int)local_e68.d[2] == 0);
    auVar10._4_4_ = -(uint)(local_e68.d[0]._4_4_ == 0 && local_e68.d[2]._4_4_ == 0);
    auVar10._8_4_ = -(uint)((int)local_e68.d[1] == 0 && (int)local_e68.d[3] == 0);
    auVar10._12_4_ = -(uint)(local_e68.d[1]._4_4_ == 0 && local_e68.d[3]._4_4_ == 0);
    iVar6 = movmskps(iVar6,auVar10);
    if ((iVar6 != 0xf) && (((uVar3 != 0 || uVar4 != 0) || uVar2 != 0) || uVar1 != 0)) {
      secp256k1_scalar_inverse(&local_d88,&local_e88);
      secp256k1_scalar_mul(&local_da8,&local_d88,&local_de8);
      secp256k1_scalar_mul(&local_dc8,&local_d88,&local_e68);
      local_c50 = local_e40.infinity;
      local_cc8._0_8_ = local_e40.x.n[0];
      local_cc8._8_8_ = local_e40.x.n[1];
      local_cc8._16_8_ = local_e40.x.n[2];
      local_cc8._24_8_ = local_e40.x.n[3];
      local_cc8._32_8_ = local_e40.x.n[4];
      local_cc8._40_8_ = local_e40.y.n[0];
      local_cc8._48_8_ = local_e40.y.n[1];
      local_cc8._56_8_ = local_e40.y.n[2];
      local_cc8._64_8_ = local_e40.y.n[3];
      local_cc8._72_8_ = local_e40.y.n[4];
      local_cc8._80_8_ = 1;
      local_cc8._88_16_ = (undefined1  [16])0x0;
      local_c60 = (undefined1  [16])0x0;
      local_d68.prej = local_6f8;
      local_d68.zr = local_838;
      local_d68.pre_a = local_2f8;
      local_d68.ps = &local_c48;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,&local_d68,&local_d48,1,(secp256k1_gej *)local_cc8,&local_dc8,
                 &local_da8);
      if (local_d48.infinity == 0) {
        secp256k1_scalar_get_b32((uchar *)local_6f8,&local_e68);
        secp256k1_fe_set_b32((secp256k1_fe *)&local_c48,(uchar *)local_6f8);
        iVar6 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_c48,&local_d48);
        if (iVar6 != 0) {
          return 1;
        }
        uVar7 = 4;
        do {
          uVar1 = secp256k1_ecdsa_const_p_minus_order.n[uVar7];
          uVar2 = *(ulong *)(local_c48.wnaf_na + (ulong)uVar7 * 2);
          if (uVar2 >= uVar1 && uVar2 != uVar1) {
            return 0;
          }
          if (uVar2 < uVar1) {
            local_c48.wnaf_na._0_8_ = local_c48.wnaf_na._0_8_ + 0x25e8cd0364141;
            local_c48.wnaf_na._8_8_ = local_c48.wnaf_na._8_8_ + 0xe6af48a03bbfd;
            local_c48.wnaf_na._16_8_ = local_c48.wnaf_na._16_8_ + 0xffffffebaaedc;
            local_c48.wnaf_na._24_8_ = local_c48.wnaf_na._24_8_ + 0xfffffffffffff;
            local_c48.wnaf_na._32_8_ = local_c48.wnaf_na._32_8_ + 0xffffffffffff;
            iVar6 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_c48,&local_d48);
            return iVar6;
          }
          bVar9 = uVar7 != 0;
          uVar7 = uVar7 - 1;
        } while (bVar9);
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msg32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msg32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&ctx->ecmult_ctx, &r, &s, &q, &m));
}